

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Items.cpp
# Opt level: O3

map<int,_std::shared_ptr<Item>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<Item>_>_>_>
* __thiscall Items::EnumerateItems(Items *this)

{
  _Rb_tree_header *p_Var1;
  map<int,_std::shared_ptr<Item>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<Item>_>_>_>
  *in_RDI;
  
  p_Var1 = &(in_RDI->_M_t)._M_impl.super__Rb_tree_header;
  (in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  *(undefined8 *)&(in_RDI->_M_t)._M_impl = 0;
  *(undefined8 *)&(in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_header = 0;
  (in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  return in_RDI;
}

Assistant:

std::map<int, std::shared_ptr<Item>> Items::EnumerateItems() {
    return std::map<int, std::shared_ptr<Item>>();
}